

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O2

int X509_VERIFY_PARAM_set1_ip(X509_VERIFY_PARAM *param,uchar *ip,size_t iplen)

{
  int iVar1;
  
  if (((iplen == 0x10) || (iplen == 4)) &&
     (iVar1 = int_x509_param_set1((char **)&param->ip,&param->iplen,(char *)ip,iplen), iVar1 != 0))
  {
    return 1;
  }
  param->poison = '\x01';
  return 0;
}

Assistant:

int X509_VERIFY_PARAM_set1_ip(X509_VERIFY_PARAM *param, const unsigned char *ip,
                              size_t iplen) {
  if ((iplen != 4 && iplen != 16) ||
      !int_x509_param_set1((char **)&param->ip, &param->iplen, (char *)ip,
                           iplen)) {
    param->poison = 1;
    return 0;
  }

  return 1;
}